

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int legendre_symbol(int q,int p)

{
  bool bVar1;
  int qstack [50];
  int pstack [50];
  int local_d8 [2];
  int power [20];
  int local_80;
  int local_7c;
  int nstack;
  int nmore;
  int nleft;
  int nfactor;
  int l;
  int i;
  int factor [20];
  int local_10;
  int p_local;
  int q_local;
  
  factor[0x13] = p;
  local_10 = q;
  if (p < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  P must be greater than 1.\n");
    exit(1);
  }
  bVar1 = i4_is_prime(p);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  P is not prime.\n");
    exit(1);
  }
  if (local_10 % factor[0x13] == 0) {
    p_local = 0;
  }
  else {
    if (factor[0x13] != 2) {
      for (; local_10 < 0; local_10 = local_10 + factor[0x13]) {
      }
      local_80 = 0;
      nleft = 1;
      do {
        while( true ) {
          local_10 = local_10 % factor[0x13];
          i4_factor(local_10,0x14,&nmore,&l,local_d8,&nstack);
          if (nstack != 1) {
            std::operator<<((ostream *)&std::cerr,"\n");
            std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
            std::operator<<((ostream *)&std::cerr,"  Not enough factorization space.\n");
            exit(1);
          }
          local_7c = 0;
          for (nfactor = 0; nfactor < nmore; nfactor = nfactor + 1) {
            if (local_d8[nfactor] % 2 == 1) {
              local_7c = local_7c + 1;
              if (0x31 < local_80) {
                std::operator<<((ostream *)&std::cerr,"\n");
                std::operator<<((ostream *)&std::cerr,"LEGENDRE_SYMBOL - Fatal error!\n");
                std::operator<<((ostream *)&std::cerr,"  Stack overflow!\n");
                exit(1);
              }
              pstack[(long)local_80 + -2] = factor[0x13];
              qstack[(long)local_80 + -2] = (&l)[nfactor];
              local_80 = local_80 + 1;
            }
          }
          if (local_7c != 0) break;
LAB_001f7187:
          if (local_80 == 0) {
            return nleft;
          }
          local_80 = local_80 + -1;
          factor[0x13] = pstack[(long)local_80 + -2];
          local_10 = qstack[(long)local_80 + -2];
        }
        local_80 = local_80 + -1;
        local_10 = qstack[(long)local_80 + -2];
        if (local_10 == 1) {
          goto LAB_001f7187;
        }
        if ((local_10 == 2) && ((factor[0x13] % 8 == 1 || (factor[0x13] % 8 == 7)))) {
          goto LAB_001f7187;
        }
        if ((local_10 == 2) && ((factor[0x13] % 8 == 3 || (factor[0x13] % 8 == 5)))) {
          nleft = -nleft;
          goto LAB_001f7187;
        }
        if ((factor[0x13] % 4 == 3) && (local_10 % 4 == 3)) {
          nleft = -nleft;
        }
        i4_swap(factor + 0x13,&local_10);
      } while( true );
    }
    p_local = 1;
  }
  return p_local;
}

Assistant:

int legendre_symbol ( int q, int p )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_SYMBOL evaluates the Legendre symbol (Q/P).
//
//  Definition:
//
//    Let P be an odd prime.  Q is a QUADRATIC RESIDUE modulo P
//    if there is an integer R such that R^2 = Q ( mod P ).
//    The Legendre symbol ( Q / P ) is defined to be:
//
//      + 1 if Q ( mod P ) /= 0 and Q is a quadratic residue modulo P,
//      - 1 if Q ( mod P ) /= 0 and Q is not a quadratic residue modulo P,
//        0 if Q ( mod P ) == 0.
//
//    We can also define ( Q / P ) for P = 2 by:
//
//      + 1 if Q ( mod P ) /= 0
//        0 if Q ( mod P ) == 0
//
//  Example:
//
//    (0/7) =   0
//    (1/7) = + 1  ( 1^2 = 1 mod 7 )
//    (2/7) = + 1  ( 3^2 = 2 mod 7 )
//    (3/7) = - 1
//    (4/7) = + 1  ( 2^2 = 4 mod 7 )
//    (5/7) = - 1
//    (6/7) = - 1
//
//  Discussion:
//
//    For any prime P, exactly half of the integers from 1 to P-1
//    are quadratic residues.
//
//    ( 0 / P ) = 0.
//
//    ( Q / P ) = ( mod ( Q, P ) / P ).
//
//    ( Q / P ) = ( Q1 / P ) * ( Q2 / P ) if Q = Q1 * Q2.
//
//    If Q is prime, and P is prime and greater than 2, then:
//
//      if ( Q == 1 ) then
//
//        ( Q / P ) = 1
//
//      else if ( Q == 2 ) then
//
//        ( Q / P ) = + 1 if mod ( P, 8 ) = 1 or mod ( P, 8 ) = 7,
//        ( Q / P ) = - 1 if mod ( P, 8 ) = 3 or mod ( P, 8 ) = 5.
//
//      else
//
//        ( Q / P ) = - ( P / Q ) if Q = 3 ( mod 4 ) and P = 3 ( mod 4 ),
//                  =   ( P / Q ) otherwise.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 March 2001
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Charles Pinter,
//    A Book of Abstract Algebra,
//    McGraw Hill, 1982, pages 236-237.
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996, pages 86-87.
//
//  Parameters:
//
//    Input, int Q, an integer whose Legendre symbol with
//    respect to P is desired.
//
//    Input, int P, a prime number, greater than 1, with respect
//    to which the Legendre symbol of Q is desired.
//
//    Output, int LEGENDRE_SYMBOL, the Legendre symbol (Q/P).
//    Ordinarily, this will be -1, 0 or 1.
//    L = -2, P is less than or equal to 1.
//    L = -3, P is not prime.
//    L = -4, the internal stack of factors overflowed.
//    L = -5, not enough factorization space.
//
{
# define FACTOR_MAX 20
# define STACK_MAX 50

  int factor[FACTOR_MAX];
  int i;
  int l;
  int nfactor;
  int nleft;
  int nmore;
  int nstack;
  int power[FACTOR_MAX];
  int pstack[STACK_MAX];
  int qstack[STACK_MAX];
//
//  P must be greater than 1.
//
  if ( p <= 1 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
    std::cerr << "  P must be greater than 1.\n";
    exit ( 1 );
  }
//
//  P must be prime.
//
  if ( !( i4_is_prime ( p ) ) )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
    std::cerr << "  P is not prime.\n";
    exit ( 1 );
  }
//
//  ( k*P / P ) = 0.
//
  if ( ( q % p ) == 0 )
  {
    return 0;
  }
//
//  For the special case P = 2, (Q/P) = 1 for all odd numbers.
//
  if ( p == 2 )
  {
    return 1;
  }
//
//  Force Q to be nonnegative.
//
  while ( q < 0 )
  {
    q = q + p;
  }

  nstack = 0;
  l = 1;

  for ( ; ; )
  {
    q = q % p;
//
//  Decompose Q into factors of prime powers.
//
    i4_factor ( q, FACTOR_MAX, nfactor, factor, power, nleft );

    if ( nleft != 1 )
    {
      std::cerr << "\n";
      std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
      std::cerr << "  Not enough factorization space.\n";
      exit ( 1 );
    }
//
//  Each factor which is an odd power is added to the stack.
//
    nmore = 0;

    for ( i = 0; i < nfactor; i++ )
    {
      if ( ( power[i] % 2 ) == 1 )
      {
        nmore = nmore + 1;

        if ( STACK_MAX <= nstack )
        {
          std::cerr << "\n";
          std::cerr << "LEGENDRE_SYMBOL - Fatal error!\n";
          std::cerr << "  Stack overflow!\n";
          exit ( 1 );
        }

        pstack[nstack] = p;
        qstack[nstack] = factor[i];
        nstack = nstack + 1;
      }

    }

    if ( nmore != 0 )
    {
      nstack = nstack - 1;
      q = qstack[nstack];
//
//  Check for a Q of 1 or 2.
//
      if ( q == 1 )
      {
        l = + 1 * l;
      }
      else if ( q == 2 && ( ( p % 8 ) == 1 || ( p % 8 ) == 7 ) )
      {
        l = + 1 * l;
      }
      else if ( q == 2 && ( ( p % 8 ) == 3 || ( p % 8 ) == 5 ) )
      {
        l = - 1 * l;
      }
      else
      {
        if ( ( p % 4 ) == 3 && ( q % 4 ) == 3 )
        {
          l = - 1 * l;
        }

        i4_swap ( &p, &q );

        continue;

      }

    }
//
//  If the stack is empty, we're done.
//
    if ( nstack == 0 )
    {
      break;
    }
//
//  Otherwise, get the last P and Q from the stack, and process them.
//
    nstack = nstack - 1;
    p = pstack[nstack];
    q = qstack[nstack];
  }

  return l;

# undef FACTOR_MAX
# undef STACK_MAX
}